

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_mxu__pool19(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  uint32_t uVar1;
  uint32_t opcode;
  DisasContext_conflict4 *ctx_local;
  CPUMIPSState_conflict2 *env_local;
  
  uVar1 = extract32(ctx->opcode,0x16,2);
  if (uVar1 < 2) {
    gen_mxu_q8mul_q8mulsu(ctx);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void decode_opc_mxu__pool19(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 22, 2);

    switch (opcode) {
    case OPC_MXU_Q8MUL:
    case OPC_MXU_Q8MULSU:
        gen_mxu_q8mul_q8mulsu(ctx);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}